

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncDrawIndirect::Setup(AdvancedSyncDrawIndirect *this)

{
  this->m_draw_program = 0;
  this->m_attribless_vao = 0;
  this->m_draw_vao = 0;
  this->m_draw_vbo = 0;
  this->m_draw_command_buffer = 0;
  this->m_draw_command_buffer_tex = 0;
  this->m_store_program = 0;
  this->m_draw_program = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_draw_command_buffer	 = 0;
		m_draw_command_buffer_tex = 0;
		m_store_program			  = 0;
		m_draw_program			  = 0;
		m_attribless_vao		  = 0;
		m_draw_vao				  = 0;
		m_draw_vbo				  = 0;
		return NO_ERROR;
	}